

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dae.cpp
# Opt level: O0

Dae * __thiscall opencollada::Dae::operator=(Dae *this,Dae *other)

{
  Uri *in_RSI;
  Dae *in_RDI;
  
  XmlDoc::operator=((XmlDoc *)in_RSI,&in_RDI->super_XmlDoc);
  Uri::operator=(in_RSI,(Uri *)in_RDI);
  ::std::
  map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
  ::operator=((map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
               *)in_RSI,
              (map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
               *)in_RDI);
  return in_RDI;
}

Assistant:

const Dae & Dae::operator = (Dae && other)
	{
		this->XmlDoc::operator=(std::move(other));
		mUri = std::move(other.mUri);
		mExternalDAEs = std::move(other.mExternalDAEs);
		return *this;
	}